

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

void helics::detail::convertFromBinary
               (byte *data,vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val
               )

{
  undefined1 uVar1;
  undefined4 uVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range3;
  undefined1 *puVar6;
  undefined1 *puVar7;
  size_t i;
  long lVar8;
  uint uVar9;
  
  uVar2 = *(undefined4 *)(data + 4);
  uVar9 = (uint)uVar2 >> 0x18 | (uint)(uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
          uVar2 << 0x18;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (val,(ulong)uVar9);
  if (uVar9 != 0) {
    memcpy((val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start,data + 8,(ulong)uVar9 << 4);
  }
  if ((*data & 1) != 0) {
    pcVar4 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar4 != pcVar3) {
      puVar5 = pcVar4->_M_value + 7;
      puVar6 = pcVar4->_M_value + 0xf;
      do {
        lVar8 = 0;
        puVar7 = puVar5;
        do {
          uVar1 = pcVar4->_M_value[lVar8];
          pcVar4->_M_value[lVar8] = *puVar7;
          *puVar7 = uVar1;
          lVar8 = lVar8 + 1;
          puVar7 = puVar7 + -1;
        } while (lVar8 != 4);
        lVar8 = 8;
        puVar7 = puVar6;
        do {
          uVar1 = pcVar4->_M_value[lVar8];
          pcVar4->_M_value[lVar8] = *puVar7;
          *puVar7 = uVar1;
          lVar8 = lVar8 + 1;
          puVar7 = puVar7 + -1;
        } while (lVar8 != 0xc);
        pcVar4 = pcVar4 + 1;
        puVar5 = puVar5 + 0x10;
        puVar6 = puVar6 + 0x10;
      } while (pcVar4 != pcVar3);
    }
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::vector<std::complex<double>>& val)
{
    const std::size_t size = getDataSize(data);
    val.resize(size);
    if (size > 0) {
        std::memcpy(reinterpret_cast<double*>(val.data()),
                    data + 8,
                    size * sizeof(std::complex<double>));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        for (auto& value : val) {
            // making use of array oriented access for complex numbers
            // See https://en.cppreference.com/w/cpp/numeric/complex
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&value));
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&value) + 8);
        }
    }
}